

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase745::run(TestCase745 *this)

{
  char *pcVar1;
  size_t sVar2;
  ReadableFile *pRVar3;
  undefined8 uVar4;
  StringPtr text;
  Own<kj::Directory,_std::nullptr_t> OVar5;
  Own<const_kj::File,_std::nullptr_t> file;
  Own<kj::Directory,_std::nullptr_t> dir;
  DebugComparison<kj::String,_const_char_(&)[7]> _kjCondition;
  TempDir tempDir;
  DebugExpression<kj::String> local_b8;
  undefined8 *local_98;
  ReadableFile *local_90;
  undefined1 local_88 [24];
  size_t sStack_70;
  ArrayDisposer *local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  char local_48;
  String local_38;
  TempDir local_20;
  
  TempDir::TempDir(&local_20);
  OVar5 = TempDir::get((TempDir *)local_88);
  (**(code **)(*(long *)local_88._8_8_ + 0x78))(&local_98,local_88._8_8_,OVar5.ptr);
  text.content.size_ = 7;
  text.content.ptr = "foobar";
  File::writeAll((File *)local_90,text);
  ReadableFile::readAllText(&local_38,local_90);
  local_b8.value.content.ptr = local_38.content.ptr;
  local_b8.value.content.size_ = local_38.content.size_;
  local_b8.value.content.disposer = local_38.content.disposer;
  local_38.content.ptr = (char *)0x0;
  local_38.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[7]> *)(local_88 + 0x10),&local_b8,
             (char (*) [7])0x4f8dfd);
  sVar2 = local_b8.value.content.size_;
  pcVar1 = local_b8.value.content.ptr;
  if ((ArrayDisposer *)local_b8.value.content.ptr != (ArrayDisposer *)0x0) {
    local_b8.value.content.ptr = (char *)0x0;
    local_b8.value.content.size_ = 0;
    (**(local_b8.value.content.disposer)->_vptr_ArrayDisposer)
              (local_b8.value.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_38.content.size_;
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_48 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<kj::String,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2ee,ERROR,
               "\"failed: expected \" \"file->readAllText() == \\\"foobar\\\"\", _kjCondition",
               (char (*) [49])"failed: expected file->readAllText() == \"foobar\"",
               (DebugComparison<kj::String,_const_char_(&)[7]> *)(local_88 + 0x10));
  }
  sVar2 = sStack_70;
  uVar4 = local_88._16_8_;
  if ((ArrayDisposer *)local_88._16_8_ != (ArrayDisposer *)0x0) {
    local_88._16_8_ = (ArrayDisposer *)0x0;
    sStack_70 = 0;
    (*(code *)*local_68->_vptr_ArrayDisposer)(local_68,uVar4,1,sVar2,sVar2,0);
  }
  (**(code **)(*(long *)local_88._8_8_ + 0x30))(&local_b8);
  local_48 = local_b8.value.content.size_ == 0;
  local_50 = 5;
  local_58 = " == ";
  local_60 = 0;
  local_68 = local_b8.value.content.disposer;
  sStack_70 = local_b8.value.content.size_;
  local_88._16_8_ = local_b8.value.content.ptr;
  local_b8.value.content.size_ = 0;
  local_b8.value.content.ptr = (char *)0x0;
  if ((!(bool)local_48) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[45],kj::_::DebugComparison<kj::Array<kj::String>,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2ef,ERROR,"\"failed: expected \" \"dir->listNames() == nullptr\", _kjCondition",
               (char (*) [45])"failed: expected dir->listNames() == nullptr",
               (DebugComparison<kj::Array<kj::String>,_std::nullptr_t> *)(local_88 + 0x10));
  }
  sVar2 = sStack_70;
  uVar4 = local_88._16_8_;
  if ((ArrayDisposer *)local_88._16_8_ != (ArrayDisposer *)0x0) {
    local_88._16_8_ = (ArrayDisposer *)0x0;
    sStack_70 = 0;
    (**local_68->_vptr_ArrayDisposer)
              (local_68,uVar4,0x18,sVar2,sVar2,ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  pRVar3 = local_90;
  if (local_90 != (ReadableFile *)0x0) {
    local_90 = (ReadableFile *)0x0;
    (**(code **)*local_98)
              (local_98,(pRVar3->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar3->super_FsNode);
  }
  uVar4 = local_88._8_8_;
  if ((long *)local_88._8_8_ != (long *)0x0) {
    local_88._8_8_ = (long *)0x0;
    (*(code *)**(undefined8 **)local_88._0_8_)
              (local_88._0_8_,uVar4 + *(long *)(*(long *)uVar4 + -0x10));
  }
  TempDir::~TempDir(&local_20);
  return;
}

Assistant:

TEST(AsyncIo, ScmRightsTruncatedOdd) {
  // Test that if we send two FDs over a unix socket, but the receiving end only receives one, we
  // don't leak the other FD.

  auto io = setupAsyncIo();

  auto capPipe = io.provider->newCapabilityPipe();

  int pipeFds[2]{};
  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in1(pipeFds[0]);
  kj::OwnFd out1(pipeFds[1]);

  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in2(pipeFds[0]);
  kj::OwnFd out2(pipeFds[1]);

  {
    OwnFd sendFds[2] = { kj::mv(out1), kj::mv(out2) };
    capPipe.ends[0]->writeWithFds("foo"_kjb, nullptr, sendFds).wait(io.waitScope);
  }

  {
    char buffer[4]{};
    OwnFd fdBuffer[1];
    auto result = capPipe.ends[1]->tryReadWithFds(buffer, 3, 3, fdBuffer, 1).wait(io.waitScope);
    KJ_ASSERT(result.capCount == 1);
    kj::FdOutputStream(fdBuffer[0].get()).write("bar"_kjb);
  }

  // We want to carefully verify that out1 and out2 were closed, without deadlocking if they
  // weren't. So we manually set nonblocking mode and then issue read()s.
  KJ_SYSCALL(fcntl(in1, F_SETFL, O_NONBLOCK));
  KJ_SYSCALL(fcntl(in2, F_SETFL, O_NONBLOCK));

  char buffer[4]{};
  ssize_t n;

  // First we read "bar" from in1.
  KJ_NONBLOCKING_SYSCALL(n = read(in1, buffer, 4));
  KJ_ASSERT(n == 3);
  buffer[3] = '\0';
  KJ_ASSERT(kj::StringPtr(buffer) == "bar");

  // Now it should be EOF.
  KJ_NONBLOCKING_SYSCALL(n = read(in1, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out1 was not closed");
  }
  KJ_ASSERT(n == 0);

  // Second pipe should have been closed implicitly because we didn't provide space to receive it.
  KJ_NONBLOCKING_SYSCALL(n = read(in2, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out2 was not closed. This could indicate that your operating system kernel is "
        "buggy and leaks file descriptors when an SCM_RIGHTS message is truncated. FreeBSD was "
        "known to do this until late 2018, while MacOS still has this bug as of this writing in "
        "2019. However, KJ works around the problem on those platforms. You need to enable the "
        "same work-around for your OS -- search for 'SCM_RIGHTS' in src/kj/async-io-unix.c++.");
  }
  KJ_ASSERT(n == 0);
}